

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Curiosity.cpp
# Opt level: O2

void __thiscall chrono::curiosity::Curiosity::Initialize(Curiosity *this,ChFrame<double> *pos)

{
  __shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2> *__r;
  element_type *peVar1;
  long *plVar2;
  long lVar3;
  ChSystem *pCVar4;
  undefined1 auVar5 [16];
  __shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2> *p_Var6;
  double dVar7;
  element_type *peVar8;
  int iVar9;
  shared_ptr<chrono::curiosity::CuriosityChassis> *psVar10;
  __shared_ptr<chrono::ChLinkMotorRotation,(__gnu_cxx::_Lock_policy)2> *p_Var11;
  long lVar12;
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  ChVector<double> v;
  __shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> local_598;
  __shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> local_588;
  shared_ptr<chrono::ChShaftsBody> shaftbody_connection;
  undefined1 auStack_568 [16];
  ChQuaternion<double> z2y;
  undefined1 local_528 [32];
  undefined8 local_508;
  undefined8 uStack_500;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_4f0;
  long local_4e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_4e0;
  undefined1 local_4d8 [16];
  shared_ptr<chrono::ChBody> local_4c8;
  shared_ptr<chrono::ChBody> local_4b8;
  shared_ptr<chrono::ChBody> local_4a8;
  shared_ptr<chrono::ChBody> local_498;
  shared_ptr<chrono::ChBody> local_488;
  shared_ptr<chrono::ChBody> local_478;
  shared_ptr<chrono::ChBody> local_468;
  shared_ptr<chrono::ChBody> local_458;
  shared_ptr<chrono::ChBody> local_448;
  shared_ptr<chrono::ChBody> local_438;
  __shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> local_420;
  __shared_ptr<chrono::curiosity::CuriosityChassis,_(__gnu_cxx::_Lock_policy)2> local_410;
  __shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> local_400;
  __shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> local_3f0;
  __shared_ptr<chrono::curiosity::CuriosityChassis,_(__gnu_cxx::_Lock_policy)2> local_3e0;
  __shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> local_3d0;
  __shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> local_3c0;
  __shared_ptr<chrono::curiosity::CuriosityChassis,_(__gnu_cxx::_Lock_policy)2> local_3b0;
  __shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> local_3a0;
  __shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> local_390;
  __shared_ptr<chrono::curiosity::CuriosityChassis,_(__gnu_cxx::_Lock_policy)2> local_380;
  __shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> local_370;
  __shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> local_360;
  __shared_ptr<chrono::curiosity::CuriosityChassis,_(__gnu_cxx::_Lock_policy)2> local_350;
  __shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> local_340;
  __shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> local_330;
  __shared_ptr<chrono::curiosity::CuriosityChassis,_(__gnu_cxx::_Lock_policy)2> local_320;
  __shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> local_310;
  __shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> local_300;
  __shared_ptr<chrono::curiosity::CuriosityChassis,_(__gnu_cxx::_Lock_policy)2> local_2f0;
  __shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> local_2e0;
  __shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> local_2d0;
  __shared_ptr<chrono::curiosity::CuriosityChassis,_(__gnu_cxx::_Lock_policy)2> local_2c0;
  __shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> local_2b0;
  __shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> local_2a0;
  __shared_ptr<chrono::curiosity::CuriosityChassis,_(__gnu_cxx::_Lock_policy)2> local_290;
  __shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> local_280;
  __shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> local_270;
  __shared_ptr<chrono::curiosity::CuriosityChassis,_(__gnu_cxx::_Lock_policy)2> local_260;
  __shared_ptr<chrono::curiosity::CuriosityChassis,_(__gnu_cxx::_Lock_policy)2> local_250;
  __shared_ptr<chrono::ChPhysicsItem,(__gnu_cxx::_Lock_policy)2> local_240 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_238;
  __shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2> local_230;
  __shared_ptr<chrono::ChPhysicsItem,(__gnu_cxx::_Lock_policy)2> local_220 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_218;
  __shared_ptr<chrono::curiosity::CuriosityChassis,_(__gnu_cxx::_Lock_policy)2> local_210;
  __shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> local_200;
  __shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> local_1f0;
  __shared_ptr<chrono::curiosity::CuriosityChassis,_(__gnu_cxx::_Lock_policy)2> local_1e0;
  __shared_ptr<chrono::curiosity::CuriosityChassis,_(__gnu_cxx::_Lock_policy)2> local_1d0;
  __shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> local_1c0;
  __shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> local_1b0;
  __shared_ptr<chrono::curiosity::CuriosityChassis,_(__gnu_cxx::_Lock_policy)2> local_1a0;
  __shared_ptr<chrono::curiosity::CuriosityChassis,_(__gnu_cxx::_Lock_policy)2> local_190;
  __shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> local_180;
  __shared_ptr<chrono::curiosity::CuriosityChassis,_(__gnu_cxx::_Lock_policy)2> local_170;
  __shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> local_160;
  __shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> local_150;
  __shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> local_140;
  __shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> local_130;
  __shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> local_120;
  __shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> local_110;
  curiosity local_100 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_f8;
  curiosity local_f0 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e8;
  curiosity local_e0 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_d8;
  curiosity local_d0 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_c8;
  __shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2> local_c0;
  __shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2> local_b0;
  curiosity local_a0 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_98;
  __shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2> local_90;
  curiosity local_80 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_78;
  __shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2> local_70;
  curiosity local_60 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  __shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  if ((this->m_driver).
      super___shared_ptr<chrono::curiosity::CuriosityDriver,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    __assert_fail("m_driver",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_models/robot/curiosity/Curiosity.cpp"
                  ,0x1c8,"void chrono::curiosity::Curiosity::Initialize(const ChFrame<> &)");
  }
  CuriosityChassis::Initialize
            ((this->m_chassis).
             super___shared_ptr<chrono::curiosity::CuriosityChassis,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr,this->m_system,pos);
  peVar1 = (this->m_diff_bar).
           super___shared_ptr<chrono::curiosity::CuriosityDifferentialBar,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  std::__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_110,
             &(((this->m_chassis).
                super___shared_ptr<chrono::curiosity::CuriosityChassis,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->super_CuriosityPart).m_body.
              super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>);
  (*(peVar1->super_CuriosityPart)._vptr_CuriosityPart[2])(peVar1,&local_110);
  psVar10 = &this->m_chassis;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_110._M_refcount);
  for (lVar12 = 0x80; lVar12 != 0xa0; lVar12 = lVar12 + 0x10) {
    plVar2 = *(long **)((long)((this->m_wheels)._M_elems + -2) + lVar12);
    std::__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_120,
               &(((this->m_chassis).
                  super___shared_ptr<chrono::curiosity::CuriosityChassis,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr)->super_CuriosityPart).m_body.
                super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>);
    (**(code **)(*plVar2 + 0x10))(plVar2,&local_120);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_120._M_refcount);
    plVar2 = *(long **)((long)&(this->m_wheels)._M_elems[0].
                               super___shared_ptr<chrono::curiosity::CuriosityWheel,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr + lVar12);
    std::__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_130,
               &(((this->m_chassis).
                  super___shared_ptr<chrono::curiosity::CuriosityChassis,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr)->super_CuriosityPart).m_body.
                super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>);
    (**(code **)(*plVar2 + 0x10))(plVar2,&local_130);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_130._M_refcount);
    plVar2 = *(long **)((long)&(this->m_rockers)._M_elems[1].
                               super___shared_ptr<chrono::curiosity::CuriosityRocker,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr + lVar12);
    std::__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_140,
               &(((this->m_chassis).
                  super___shared_ptr<chrono::curiosity::CuriosityChassis,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr)->super_CuriosityPart).m_body.
                super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>);
    (**(code **)(*plVar2 + 0x10))(plVar2,&local_140);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_140._M_refcount);
    plVar2 = *(long **)((long)&(this->m_wheels)._M_elems[2].
                               super___shared_ptr<chrono::curiosity::CuriosityWheel,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr + lVar12);
    std::__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_150,
               &(((this->m_chassis).
                  super___shared_ptr<chrono::curiosity::CuriosityChassis,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr)->super_CuriosityPart).m_body.
                super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>);
    (**(code **)(*plVar2 + 0x10))(plVar2,&local_150);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_150._M_refcount);
    plVar2 = *(long **)((long)&(this->m_wheels)._M_elems[4].
                               super___shared_ptr<chrono::curiosity::CuriosityWheel,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr + lVar12);
    std::__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_160,
               &(((this->m_chassis).
                  super___shared_ptr<chrono::curiosity::CuriosityChassis,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr)->super_CuriosityPart).m_body.
                super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>);
    (**(code **)(*plVar2 + 0x10))(plVar2,&local_160);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_160._M_refcount);
  }
  for (lVar12 = 0x20; lVar12 != 0x80; lVar12 = lVar12 + 0x10) {
    plVar2 = *(long **)((long)((this->m_wheels)._M_elems + -2) + lVar12);
    std::__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_40,
               &(((this->m_chassis).
                  super___shared_ptr<chrono::curiosity::CuriosityChassis,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr)->super_CuriosityPart).m_body.
                super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>);
    (**(code **)(*plVar2 + 0x10))(plVar2,&local_40);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  }
  chrono::Q_from_AngX(1.5707963267948966);
  p_Var11 = (__shared_ptr<chrono::ChLinkMotorRotation,(__gnu_cxx::_Lock_policy)2> *)
            &this->m_drive_motors;
  for (lVar12 = 0; lVar12 != 0x30; lVar12 = lVar12 + 0x18) {
    iVar9 = (*((this->m_driver).
               super___shared_ptr<chrono::curiosity::CuriosityDriver,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->_vptr_CuriosityDriver[2])();
    if (iVar9 == 1) {
      std::__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_420,
                 (__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> *)
                 (*(long *)(p_Var11 + -0x150) + 0x28));
      std::__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_180,
                 (__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> *)
                 (*(long *)(p_Var11 + -0x1f0) + 0x28));
      std::__shared_ptr<chrono::curiosity::CuriosityChassis,_(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr(&local_190,
                   &psVar10->
                    super___shared_ptr<chrono::curiosity::CuriosityChassis,_(__gnu_cxx::_Lock_policy)2>
                  );
      AddRevoluteJoint(local_60,(shared_ptr<chrono::ChBodyAuxRef> *)&local_420,
                       (shared_ptr<chrono::ChBodyAuxRef> *)&local_180,
                       (shared_ptr<chrono::curiosity::CuriosityChassis> *)&local_190,
                       (ChVector<double> *)(wheel_pos + lVar12),&z2y);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_190._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_180._M_refcount);
      p_Var6 = (__shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2> *)&local_420;
LAB_0016fe7c:
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&p_Var6->_M_refcount);
    }
    else if (iVar9 == 0) {
      std::make_shared<chrono::ChFunction_Setpoint>();
      std::__shared_ptr<chrono::ChFunction_Setpoint,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<chrono::ChFunction_Setpoint,_(__gnu_cxx::_Lock_policy)2> *)
                 (p_Var11 + 0x60),
                 (__shared_ptr<chrono::ChFunction_Setpoint,_(__gnu_cxx::_Lock_policy)2> *)local_528)
      ;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_528 + 8));
      std::__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> *)
                 &shaftbody_connection,
                 (__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> *)
                 (*(long *)(p_Var11 + -0x150) + 0x28));
      local_438.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           shaftbody_connection.super___shared_ptr<chrono::ChShaftsBody,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
      local_438.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           shaftbody_connection.super___shared_ptr<chrono::ChShaftsBody,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
      shaftbody_connection.super___shared_ptr<chrono::ChShaftsBody,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)SUB168(ZEXT816(0) << 0x20,0);
      shaftbody_connection.super___shared_ptr<chrono::ChShaftsBody,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)SUB168(ZEXT816(0) << 0x20,8);
      std::__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> *)&v,
                 (__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> *)
                 (*(long *)(p_Var11 + -0x1f0) + 0x28));
      local_448.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)v.m_data[0];
      local_448.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)v.m_data[1];
      v.m_data[0] = 0.0;
      v.m_data[1] = 0.0;
      std::__shared_ptr<chrono::curiosity::CuriosityChassis,_(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr(&local_170,
                   &psVar10->
                    super___shared_ptr<chrono::curiosity::CuriosityChassis,_(__gnu_cxx::_Lock_policy)2>
                  );
      AddMotorSpeed((curiosity *)local_528,&local_438,&local_448,
                    (shared_ptr<chrono::curiosity::CuriosityChassis> *)&local_170,
                    (ChVector<double> *)(wheel_pos + lVar12),&z2y);
      std::__shared_ptr<chrono::ChLinkMotorRotation,(__gnu_cxx::_Lock_policy)2>::operator=
                (p_Var11,(__shared_ptr<chrono::ChLinkMotorRotationSpeed,_(__gnu_cxx::_Lock_policy)2>
                          *)local_528);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_528 + 8));
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_170._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_448.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(v.m_data + 1));
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_438.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&shaftbody_connection.
                  super___shared_ptr<chrono::ChShaftsBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      lVar3 = *(long *)p_Var11;
      std::__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<chrono::ChFunction_Setpoint,void>
                ((__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2> *)&local_50,
                 (__shared_ptr<chrono::ChFunction_Setpoint,_(__gnu_cxx::_Lock_policy)2> *)
                 (p_Var11 + 0x60));
      std::__shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2> *)(lVar3 + 0x250),
                 &local_50);
      p_Var6 = &local_50;
      goto LAB_0016fe7c;
    }
    p_Var11 = p_Var11 + 0x10;
  }
  p_Var11 = (__shared_ptr<chrono::ChLinkMotorRotation,(__gnu_cxx::_Lock_policy)2> *)
            ((this->m_drive_motors)._M_elems + 2);
  for (lVar12 = 0; lVar12 != 0x30; lVar12 = lVar12 + 0x18) {
    iVar9 = (*((this->m_driver).
               super___shared_ptr<chrono::curiosity::CuriosityDriver,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->_vptr_CuriosityDriver[2])();
    if (iVar9 == 1) {
      std::__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_1b0,
                 (__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> *)
                 (*(long *)(p_Var11 + -400) + 0x28));
      std::__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_1c0,
                 (__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> *)
                 (*(long *)(p_Var11 + -0x1f0) + 0x28));
      std::__shared_ptr<chrono::curiosity::CuriosityChassis,_(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr(&local_1d0,
                   &psVar10->
                    super___shared_ptr<chrono::curiosity::CuriosityChassis,_(__gnu_cxx::_Lock_policy)2>
                  );
      AddRevoluteJoint(local_80,(shared_ptr<chrono::ChBodyAuxRef> *)&local_1b0,
                       (shared_ptr<chrono::ChBodyAuxRef> *)&local_1c0,
                       (shared_ptr<chrono::curiosity::CuriosityChassis> *)&local_1d0,
                       (ChVector<double> *)(wheel_pos + lVar12 + 0x30),&z2y);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1d0._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1c0._M_refcount);
      p_Var6 = (__shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2> *)&local_1b0;
LAB_001700d4:
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&p_Var6->_M_refcount);
    }
    else if (iVar9 == 0) {
      std::make_shared<chrono::ChFunction_Setpoint>();
      std::__shared_ptr<chrono::ChFunction_Setpoint,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<chrono::ChFunction_Setpoint,_(__gnu_cxx::_Lock_policy)2> *)
                 (p_Var11 + 0x60),
                 (__shared_ptr<chrono::ChFunction_Setpoint,_(__gnu_cxx::_Lock_policy)2> *)local_528)
      ;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_528 + 8));
      std::__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> *)
                 &shaftbody_connection,
                 (__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> *)
                 (*(long *)(p_Var11 + -400) + 0x28));
      local_458.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           shaftbody_connection.super___shared_ptr<chrono::ChShaftsBody,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
      local_458.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           shaftbody_connection.super___shared_ptr<chrono::ChShaftsBody,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
      shaftbody_connection.super___shared_ptr<chrono::ChShaftsBody,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)SUB168(ZEXT816(0) << 0x20,0);
      shaftbody_connection.super___shared_ptr<chrono::ChShaftsBody,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)SUB168(ZEXT816(0) << 0x20,8);
      std::__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> *)&v,
                 (__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> *)
                 (*(long *)(p_Var11 + -0x1f0) + 0x28));
      local_468.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)v.m_data[0];
      local_468.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)v.m_data[1];
      v.m_data[0] = 0.0;
      v.m_data[1] = 0.0;
      std::__shared_ptr<chrono::curiosity::CuriosityChassis,_(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr(&local_1a0,
                   &psVar10->
                    super___shared_ptr<chrono::curiosity::CuriosityChassis,_(__gnu_cxx::_Lock_policy)2>
                  );
      AddMotorSpeed((curiosity *)local_528,&local_458,&local_468,
                    (shared_ptr<chrono::curiosity::CuriosityChassis> *)&local_1a0,
                    (ChVector<double> *)(wheel_pos + lVar12 + 0x30),&z2y);
      std::__shared_ptr<chrono::ChLinkMotorRotation,(__gnu_cxx::_Lock_policy)2>::operator=
                (p_Var11,(__shared_ptr<chrono::ChLinkMotorRotationSpeed,_(__gnu_cxx::_Lock_policy)2>
                          *)local_528);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_528 + 8));
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1a0._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_468.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(v.m_data + 1));
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_458.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&shaftbody_connection.
                  super___shared_ptr<chrono::ChShaftsBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      lVar3 = *(long *)p_Var11;
      std::__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<chrono::ChFunction_Setpoint,void>
                ((__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2> *)&local_70,
                 (__shared_ptr<chrono::ChFunction_Setpoint,_(__gnu_cxx::_Lock_policy)2> *)
                 (p_Var11 + 0x60));
      std::__shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2> *)(lVar3 + 0x250),
                 &local_70);
      p_Var6 = &local_70;
      goto LAB_001700d4;
    }
    p_Var11 = p_Var11 + 0x10;
  }
  lVar12 = 0;
  p_Var11 = (__shared_ptr<chrono::ChLinkMotorRotation,(__gnu_cxx::_Lock_policy)2> *)
            ((this->m_drive_motors)._M_elems + 4);
  do {
    if (lVar12 == 0x30) {
      local_4d8 = vmovhpd_avx(ZEXT816(0) << 0x40,0xbff0000000000000);
      local_4f0 = &local_230._M_refcount;
      for (lVar12 = 0x2d0; lVar12 != 0x330; lVar12 = lVar12 + 0x10) {
        __r = (__shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2> *)
              ((long)((this->m_wheels)._M_elems + -2) + lVar12);
        chrono::ChShaft::SetInertia(0.1);
        pCVar4 = this->m_system;
        std::__shared_ptr<chrono::ChPhysicsItem,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<chrono::ChShaft,void>(local_220,__r);
        chrono::ChSystem::Add(pCVar4,local_220);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_218);
        std::make_shared<chrono::ChShaftsBody>();
        peVar8 = shaftbody_connection.
                 super___shared_ptr<chrono::ChShaftsBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        std::__shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_230,__r)
        ;
        std::__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> *)&v,
                   (__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> *)
                   (*(long *)((long)this + lVar12 + -0x2b0) + 0x28));
        local_4e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)v.m_data[1];
        dVar7 = v.m_data[0];
        v.m_data[0] = 0.0;
        v.m_data[1] = 0.0;
        local_4e8 = (long)dVar7 + 0x78;
        if (dVar7 == 0.0) {
          local_4e8 = 0;
        }
        local_528._16_8_ = 0;
        local_528._0_16_ = local_4d8;
        chrono::ChShaftsBody::Initialize(peVar8,&local_230,&local_4e8,local_528);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_4e0);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(v.m_data + 1));
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_230._M_refcount);
        pCVar4 = this->m_system;
        std::__shared_ptr<chrono::ChPhysicsItem,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<chrono::ChShaftsBody,void>
                  (local_240,
                   &shaftbody_connection.
                    super___shared_ptr<chrono::ChShaftsBody,_(__gnu_cxx::_Lock_policy)2>);
        chrono::ChSystem::Add(pCVar4,local_240);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_238);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&shaftbody_connection.
                    super___shared_ptr<chrono::ChShaftsBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                  );
      }
      auVar13._8_8_ = sr_rel_pos_lf._16_8_;
      auVar13._0_8_ = sr_rel_pos_lf._16_8_;
      auVar13._16_8_ = sr_rel_pos_lf._16_8_;
      auVar13._24_8_ = sr_rel_pos_lf._16_8_;
      lVar12 = 0;
      p_Var11 = (__shared_ptr<chrono::ChLinkMotorRotation,(__gnu_cxx::_Lock_policy)2> *)
                &this->m_rocker_motors;
      auVar13 = vblendpd_avx(ZEXT1632(sr_rel_pos_lf._0_16_),auVar13,4);
      auVar15._8_8_ = sr_rel_pos_rf;
      auVar15._0_8_ = sr_rel_pos_rf;
      auVar15._16_8_ = sr_rel_pos_rf;
      auVar15._24_8_ = sr_rel_pos_rf;
      local_528 = vblendpd_avx(auVar13,auVar15,8);
      local_508 = _DAT_001a6ab8;
      uStack_500 = _DAT_001a6ac0;
      for (; lVar12 != 0x30; lVar12 = lVar12 + 0x18) {
        v.m_data[0] = 0.0;
        std::make_shared<chrono::ChFunction_Const,double>((double *)&shaftbody_connection);
        local_4d8._0_8_ =
             (__shared_ptr<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2> *)(p_Var11 + 0x40);
        std::__shared_ptr<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_ptr<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2> *)
                   (p_Var11 + 0x40),
                   (__shared_ptr<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2> *)
                   &shaftbody_connection);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&shaftbody_connection.
                    super___shared_ptr<chrono::ChShaftsBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                  );
        std::__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_598,
                   (__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> *)
                   (*(long *)(p_Var11 + -0xd0) + 0x28));
        local_498.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)local_598._M_ptr;
        local_498.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             local_598._M_refcount._M_pi;
        local_598 = (__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>)
                    (ZEXT816(0) << 0x20);
        std::__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_588,
                   (__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> *)
                   (*(long *)(p_Var11 + -0x110) + 0x28));
        local_4a8.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)local_588._M_ptr;
        local_4a8.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             local_588._M_refcount._M_pi;
        local_588 = (__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>)
                    (ZEXT816(0) << 0x20);
        std::__shared_ptr<chrono::curiosity::CuriosityChassis,_(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr(&local_250,
                     &psVar10->
                      super___shared_ptr<chrono::curiosity::CuriosityChassis,_(__gnu_cxx::_Lock_policy)2>
                    );
        chrono::Q_from_AngX(3.141592653589793);
        AddMotorAngle((curiosity *)&v,&local_498,&local_4a8,
                      (shared_ptr<chrono::curiosity::CuriosityChassis> *)&local_250,
                      (ChVector<double> *)(local_528 + lVar12),
                      (ChQuaternion<double> *)&shaftbody_connection);
        std::__shared_ptr<chrono::ChLinkMotorRotation,(__gnu_cxx::_Lock_policy)2>::operator=
                  (p_Var11,(__shared_ptr<chrono::ChLinkMotorRotationAngle,_(__gnu_cxx::_Lock_policy)2>
                            *)&v);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(v.m_data + 1));
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_250._M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_4a8.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_588._M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_498.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_598._M_refcount);
        lVar3 = *(long *)p_Var11;
        std::__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<chrono::ChFunction_Const,void>
                  ((__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2> *)&local_b0,
                   (__shared_ptr<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2> *)
                   local_4d8._0_8_);
        std::__shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2> *)(lVar3 + 0x250),
                   &local_b0);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b0._M_refcount);
        p_Var11 = p_Var11 + 0x10;
      }
      auVar14._8_8_ = sr_rel_pos_lb._16_8_;
      auVar14._0_8_ = sr_rel_pos_lb._16_8_;
      auVar14._16_8_ = sr_rel_pos_lb._16_8_;
      auVar14._24_8_ = sr_rel_pos_lb._16_8_;
      lVar12 = 0;
      p_Var11 = (__shared_ptr<chrono::ChLinkMotorRotation,(__gnu_cxx::_Lock_policy)2> *)
                &this->m_bogie_motors;
      auVar13 = vblendpd_avx(ZEXT1632(sr_rel_pos_lb._0_16_),auVar14,4);
      auVar16._8_8_ = sr_rel_pos_rb;
      auVar16._0_8_ = sr_rel_pos_rb;
      auVar16._16_8_ = sr_rel_pos_rb;
      auVar16._24_8_ = sr_rel_pos_rb;
      _shaftbody_connection = vblendpd_avx(auVar13,auVar16,8);
      for (; lVar12 != 0x30; lVar12 = lVar12 + 0x18) {
        auVar5._8_8_ = 0;
        auVar5._0_8_ = local_598._M_refcount._M_pi;
        local_598 = (__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>)(auVar5 << 0x40)
        ;
        std::make_shared<chrono::ChFunction_Const,double>((double *)&v);
        std::__shared_ptr<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_ptr<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2> *)
                   (p_Var11 + 0x40),
                   (__shared_ptr<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2> *)&v);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(v.m_data + 1));
        std::__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_598,
                   (__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> *)
                   (*(long *)(p_Var11 + -0xd0) + 0x28));
        local_4b8.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)local_598._M_ptr;
        local_4b8.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             local_598._M_refcount._M_pi;
        local_598 = (__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>)
                    (ZEXT816(0) << 0x20);
        std::__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_588,
                   (__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> *)
                   (*(long *)(p_Var11 + -0x110) + 0x28));
        local_4c8.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)local_588._M_ptr;
        local_4c8.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             local_588._M_refcount._M_pi;
        local_588 = (__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>)ZEXT816(0);
        std::__shared_ptr<chrono::curiosity::CuriosityChassis,_(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr(&local_260,
                     &psVar10->
                      super___shared_ptr<chrono::curiosity::CuriosityChassis,_(__gnu_cxx::_Lock_policy)2>
                    );
        AddMotorAngle((curiosity *)&v,&local_4b8,&local_4c8,
                      (shared_ptr<chrono::curiosity::CuriosityChassis> *)&local_260,
                      (ChVector<double> *)
                      ((long)&shaftbody_connection.
                              super___shared_ptr<chrono::ChShaftsBody,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr + lVar12),(ChQuaternion<double> *)&QUNIT);
        std::__shared_ptr<chrono::ChLinkMotorRotation,(__gnu_cxx::_Lock_policy)2>::operator=
                  (p_Var11,(__shared_ptr<chrono::ChLinkMotorRotationAngle,_(__gnu_cxx::_Lock_policy)2>
                            *)&v);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(v.m_data + 1));
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_260._M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_4c8.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_588._M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_4b8.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_598._M_refcount);
        lVar3 = *(long *)p_Var11;
        std::__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<chrono::ChFunction_Const,void>
                  ((__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2> *)&local_c0,
                   (__shared_ptr<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2> *)
                   (p_Var11 + 0x40));
        std::__shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2> *)(lVar3 + 0x250),
                   &local_c0);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c0._M_refcount);
        p_Var11 = p_Var11 + 0x10;
      }
      std::__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_270,
                 &(((this->m_diff_bar).
                    super___shared_ptr<chrono::curiosity::CuriosityDifferentialBar,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->super_CuriosityPart).m_body.
                  super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>);
      std::__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_280,
                 &(((this->m_chassis).
                    super___shared_ptr<chrono::curiosity::CuriosityChassis,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->super_CuriosityPart).m_body.
                  super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>);
      std::__shared_ptr<chrono::curiosity::CuriosityChassis,_(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr(&local_290,
                   &psVar10->
                    super___shared_ptr<chrono::curiosity::CuriosityChassis,_(__gnu_cxx::_Lock_policy)2>
                  );
      AddRevoluteJoint((curiosity *)&v,(shared_ptr<chrono::ChBodyAuxRef> *)&local_270,
                       (shared_ptr<chrono::ChBodyAuxRef> *)&local_280,
                       (shared_ptr<chrono::curiosity::CuriosityChassis> *)&local_290,
                       (ChVector<double> *)&tr_rel_pos_t,(ChQuaternion<double> *)&QUNIT);
      std::__shared_ptr<chrono::ChLinkLockRevolute,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&(this->m_diff_joint).
                  super___shared_ptr<chrono::ChLinkLockRevolute,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<chrono::ChLinkLockRevolute,_(__gnu_cxx::_Lock_policy)2> *)&v);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(v.m_data + 1));
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_290._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_280._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_270._M_refcount);
      std::__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_2a0,
                 &(((this->m_rockers)._M_elems[0].
                    super___shared_ptr<chrono::curiosity::CuriosityRocker,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->super_CuriosityPart).m_body.
                  super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>);
      std::__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_2b0,
                 &(((this->m_diff_links)._M_elems[0].
                    super___shared_ptr<chrono::curiosity::CuriosityDifferentialLink,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->super_CuriosityPart).m_body.
                  super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>);
      std::__shared_ptr<chrono::curiosity::CuriosityChassis,_(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr(&local_2c0,
                   &psVar10->
                    super___shared_ptr<chrono::curiosity::CuriosityChassis,_(__gnu_cxx::_Lock_policy)2>
                  );
      AddRevoluteJoint(local_d0,(shared_ptr<chrono::ChBodyAuxRef> *)&local_2a0,
                       (shared_ptr<chrono::ChBodyAuxRef> *)&local_2b0,
                       (shared_ptr<chrono::curiosity::CuriosityChassis> *)&local_2c0,
                       (ChVector<double> *)tr_rel_pos_l,&z2y);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_2c0._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_2b0._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_2a0._M_refcount);
      std::__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_2d0,
                 &(((this->m_rockers)._M_elems[1].
                    super___shared_ptr<chrono::curiosity::CuriosityRocker,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->super_CuriosityPart).m_body.
                  super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>);
      std::__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_2e0,
                 &(((this->m_diff_links)._M_elems[1].
                    super___shared_ptr<chrono::curiosity::CuriosityDifferentialLink,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->super_CuriosityPart).m_body.
                  super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>);
      std::__shared_ptr<chrono::curiosity::CuriosityChassis,_(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr(&local_2f0,
                   &psVar10->
                    super___shared_ptr<chrono::curiosity::CuriosityChassis,_(__gnu_cxx::_Lock_policy)2>
                  );
      AddRevoluteJoint(local_e0,(shared_ptr<chrono::ChBodyAuxRef> *)&local_2d0,
                       (shared_ptr<chrono::ChBodyAuxRef> *)&local_2e0,
                       (shared_ptr<chrono::curiosity::CuriosityChassis> *)&local_2f0,
                       (ChVector<double> *)tr_rel_pos_r,&z2y);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_d8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_2f0._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_2e0._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_2d0._M_refcount);
      std::__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_300,
                 &(((this->m_diff_links)._M_elems[0].
                    super___shared_ptr<chrono::curiosity::CuriosityDifferentialLink,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->super_CuriosityPart).m_body.
                  super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>);
      std::__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_310,
                 &(((this->m_diff_bar).
                    super___shared_ptr<chrono::curiosity::CuriosityDifferentialBar,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->super_CuriosityPart).m_body.
                  super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>);
      std::__shared_ptr<chrono::curiosity::CuriosityChassis,_(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr(&local_320,
                   &psVar10->
                    super___shared_ptr<chrono::curiosity::CuriosityChassis,_(__gnu_cxx::_Lock_policy)2>
                  );
      v.m_data[0] = (double)tr_rel_pos_l._0_8_ + (tr_rel_pos_t - (double)tr_rel_pos_l._0_8_);
      v.m_data[1] = (double)tr_rel_pos_l._8_8_ + 0.0;
      v.m_data[2] = (double)tr_rel_pos_l._16_8_ + 0.0;
      AddRevoluteJoint(local_f0,(shared_ptr<chrono::ChBodyAuxRef> *)&local_300,
                       (shared_ptr<chrono::ChBodyAuxRef> *)&local_310,
                       (shared_ptr<chrono::curiosity::CuriosityChassis> *)&local_320,&v,
                       (ChQuaternion<double> *)&QUNIT);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_e8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_320._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_310._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_300._M_refcount);
      std::__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_330,
                 &(((this->m_diff_links)._M_elems[1].
                    super___shared_ptr<chrono::curiosity::CuriosityDifferentialLink,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->super_CuriosityPart).m_body.
                  super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>);
      std::__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_340,
                 &(((this->m_diff_bar).
                    super___shared_ptr<chrono::curiosity::CuriosityDifferentialBar,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->super_CuriosityPart).m_body.
                  super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>);
      std::__shared_ptr<chrono::curiosity::CuriosityChassis,_(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr(&local_350,
                   &psVar10->
                    super___shared_ptr<chrono::curiosity::CuriosityChassis,_(__gnu_cxx::_Lock_policy)2>
                  );
      v.m_data[0] = (double)tr_rel_pos_r._0_8_ + (tr_rel_pos_t - (double)tr_rel_pos_r._0_8_);
      v.m_data[1] = (double)tr_rel_pos_r._8_8_ + 0.0;
      v.m_data[2] = (double)tr_rel_pos_r._16_8_ + 0.0;
      AddRevoluteJoint(local_100,(shared_ptr<chrono::ChBodyAuxRef> *)&local_330,
                       (shared_ptr<chrono::ChBodyAuxRef> *)&local_340,
                       (shared_ptr<chrono::curiosity::CuriosityChassis> *)&local_350,&v,
                       (ChQuaternion<double> *)&QUNIT);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_f8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_350._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_340._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_330._M_refcount);
      std::__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_360,
                 &(((this->m_rockers)._M_elems[0].
                    super___shared_ptr<chrono::curiosity::CuriosityRocker,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->super_CuriosityPart).m_body.
                  super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>);
      std::__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_370,
                 &(((this->m_chassis).
                    super___shared_ptr<chrono::curiosity::CuriosityChassis,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->super_CuriosityPart).m_body.
                  super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>);
      std::__shared_ptr<chrono::curiosity::CuriosityChassis,_(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr(&local_380,
                   &psVar10->
                    super___shared_ptr<chrono::curiosity::CuriosityChassis,_(__gnu_cxx::_Lock_policy)2>
                  );
      AddRevoluteJoint((curiosity *)&v,(shared_ptr<chrono::ChBodyAuxRef> *)&local_360,
                       (shared_ptr<chrono::ChBodyAuxRef> *)&local_370,
                       (shared_ptr<chrono::curiosity::CuriosityChassis> *)&local_380,
                       (ChVector<double> *)cr_rel_pos_lf,&z2y);
      std::__shared_ptr<chrono::ChLinkLockRevolute,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<chrono::ChLinkLockRevolute,_(__gnu_cxx::_Lock_policy)2> *)
                 &this->m_rocker_joints,
                 (__shared_ptr<chrono::ChLinkLockRevolute,_(__gnu_cxx::_Lock_policy)2> *)&v);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(v.m_data + 1));
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_380._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_370._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_360._M_refcount);
      std::__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_390,
                 &(((this->m_rockers)._M_elems[1].
                    super___shared_ptr<chrono::curiosity::CuriosityRocker,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->super_CuriosityPart).m_body.
                  super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>);
      std::__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_3a0,
                 &(((this->m_chassis).
                    super___shared_ptr<chrono::curiosity::CuriosityChassis,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->super_CuriosityPart).m_body.
                  super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>);
      std::__shared_ptr<chrono::curiosity::CuriosityChassis,_(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr(&local_3b0,
                   &psVar10->
                    super___shared_ptr<chrono::curiosity::CuriosityChassis,_(__gnu_cxx::_Lock_policy)2>
                  );
      AddRevoluteJoint((curiosity *)&v,(shared_ptr<chrono::ChBodyAuxRef> *)&local_390,
                       (shared_ptr<chrono::ChBodyAuxRef> *)&local_3a0,
                       (shared_ptr<chrono::curiosity::CuriosityChassis> *)&local_3b0,
                       (ChVector<double> *)cr_rel_pos_rf,&z2y);
      std::__shared_ptr<chrono::ChLinkLockRevolute,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&(this->m_rocker_joints)._M_elems[1].
                  super___shared_ptr<chrono::ChLinkLockRevolute,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<chrono::ChLinkLockRevolute,_(__gnu_cxx::_Lock_policy)2> *)&v);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(v.m_data + 1));
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_3b0._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_3a0._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_390._M_refcount);
      std::__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_3c0,
                 &(((this->m_bogies)._M_elems[0].
                    super___shared_ptr<chrono::curiosity::CuriosityBogie,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->super_CuriosityPart).m_body.
                  super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>);
      std::__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_3d0,
                 &(((this->m_rockers)._M_elems[0].
                    super___shared_ptr<chrono::curiosity::CuriosityRocker,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->super_CuriosityPart).m_body.
                  super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>);
      std::__shared_ptr<chrono::curiosity::CuriosityChassis,_(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr(&local_3e0,
                   &psVar10->
                    super___shared_ptr<chrono::curiosity::CuriosityChassis,_(__gnu_cxx::_Lock_policy)2>
                  );
      AddRevoluteJoint((curiosity *)&v,(shared_ptr<chrono::ChBodyAuxRef> *)&local_3c0,
                       (shared_ptr<chrono::ChBodyAuxRef> *)&local_3d0,
                       (shared_ptr<chrono::curiosity::CuriosityChassis> *)&local_3e0,
                       (ChVector<double> *)cr_rel_pos_lb,&z2y);
      std::__shared_ptr<chrono::ChLinkLockRevolute,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<chrono::ChLinkLockRevolute,_(__gnu_cxx::_Lock_policy)2> *)
                 &this->m_bogie_joints,
                 (__shared_ptr<chrono::ChLinkLockRevolute,_(__gnu_cxx::_Lock_policy)2> *)&v);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(v.m_data + 1));
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_3e0._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_3d0._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_3c0._M_refcount);
      std::__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_3f0,
                 &(((this->m_bogies)._M_elems[1].
                    super___shared_ptr<chrono::curiosity::CuriosityBogie,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->super_CuriosityPart).m_body.
                  super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>);
      std::__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_400,
                 &(((this->m_rockers)._M_elems[1].
                    super___shared_ptr<chrono::curiosity::CuriosityRocker,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->super_CuriosityPart).m_body.
                  super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>);
      std::__shared_ptr<chrono::curiosity::CuriosityChassis,_(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr(&local_410,
                   &psVar10->
                    super___shared_ptr<chrono::curiosity::CuriosityChassis,_(__gnu_cxx::_Lock_policy)2>
                  );
      AddRevoluteJoint((curiosity *)&v,(shared_ptr<chrono::ChBodyAuxRef> *)&local_3f0,
                       (shared_ptr<chrono::ChBodyAuxRef> *)&local_400,
                       (shared_ptr<chrono::curiosity::CuriosityChassis> *)&local_410,
                       (ChVector<double> *)cr_rel_pos_rb,&z2y);
      std::__shared_ptr<chrono::ChLinkLockRevolute,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&(this->m_bogie_joints)._M_elems[1].
                  super___shared_ptr<chrono::ChLinkLockRevolute,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<chrono::ChLinkLockRevolute,_(__gnu_cxx::_Lock_policy)2> *)&v);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(v.m_data + 1));
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_410._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_400._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_3f0._M_refcount);
      this->m_initialized = true;
      return;
    }
    iVar9 = (*((this->m_driver).
               super___shared_ptr<chrono::curiosity::CuriosityDriver,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->_vptr_CuriosityDriver[2])();
    if (iVar9 == 1) {
      std::__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_1f0,
                 (__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> *)
                 (*(long *)(p_Var11 + -0x170) + 0x28));
      std::__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_200,
                 (__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> *)
                 (*(long *)(p_Var11 + -0x1f0) + 0x28));
      std::__shared_ptr<chrono::curiosity::CuriosityChassis,_(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr(&local_210,
                   &psVar10->
                    super___shared_ptr<chrono::curiosity::CuriosityChassis,_(__gnu_cxx::_Lock_policy)2>
                  );
      AddRevoluteJoint(local_a0,(shared_ptr<chrono::ChBodyAuxRef> *)&local_1f0,
                       (shared_ptr<chrono::ChBodyAuxRef> *)&local_200,
                       (shared_ptr<chrono::curiosity::CuriosityChassis> *)&local_210,
                       (ChVector<double> *)(wheel_pos + lVar12 + 0x60),&z2y);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_98);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_210._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_200._M_refcount);
      p_Var6 = (__shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2> *)&local_1f0;
LAB_0017032c:
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&p_Var6->_M_refcount);
    }
    else if (iVar9 == 0) {
      std::make_shared<chrono::ChFunction_Setpoint>();
      std::__shared_ptr<chrono::ChFunction_Setpoint,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<chrono::ChFunction_Setpoint,_(__gnu_cxx::_Lock_policy)2> *)
                 (p_Var11 + 0x60),
                 (__shared_ptr<chrono::ChFunction_Setpoint,_(__gnu_cxx::_Lock_policy)2> *)local_528)
      ;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_528 + 8));
      std::__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> *)
                 &shaftbody_connection,
                 (__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> *)
                 (*(long *)(p_Var11 + -0x170) + 0x28));
      local_478.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           shaftbody_connection.super___shared_ptr<chrono::ChShaftsBody,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
      local_478.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           shaftbody_connection.super___shared_ptr<chrono::ChShaftsBody,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
      shaftbody_connection.super___shared_ptr<chrono::ChShaftsBody,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)SUB168(ZEXT816(0) << 0x20,0);
      shaftbody_connection.super___shared_ptr<chrono::ChShaftsBody,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)SUB168(ZEXT816(0) << 0x20,8);
      std::__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> *)&v,
                 (__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> *)
                 (*(long *)(p_Var11 + -0x1f0) + 0x28));
      local_488.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)v.m_data[0];
      local_488.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)v.m_data[1];
      v.m_data[0] = 0.0;
      v.m_data[1] = 0.0;
      std::__shared_ptr<chrono::curiosity::CuriosityChassis,_(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr(&local_1e0,
                   &psVar10->
                    super___shared_ptr<chrono::curiosity::CuriosityChassis,_(__gnu_cxx::_Lock_policy)2>
                  );
      AddMotorSpeed((curiosity *)local_528,&local_478,&local_488,
                    (shared_ptr<chrono::curiosity::CuriosityChassis> *)&local_1e0,
                    (ChVector<double> *)(wheel_pos + lVar12 + 0x60),&z2y);
      std::__shared_ptr<chrono::ChLinkMotorRotation,(__gnu_cxx::_Lock_policy)2>::operator=
                (p_Var11,(__shared_ptr<chrono::ChLinkMotorRotationSpeed,_(__gnu_cxx::_Lock_policy)2>
                          *)local_528);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_528 + 8));
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1e0._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_488.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(v.m_data + 1));
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_478.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&shaftbody_connection.
                  super___shared_ptr<chrono::ChShaftsBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      lVar3 = *(long *)p_Var11;
      std::__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<chrono::ChFunction_Setpoint,void>
                ((__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2> *)&local_90,
                 (__shared_ptr<chrono::ChFunction_Setpoint,_(__gnu_cxx::_Lock_policy)2> *)
                 (p_Var11 + 0x60));
      std::__shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2> *)(lVar3 + 0x250),
                 &local_90);
      p_Var6 = &local_90;
      goto LAB_0017032c;
    }
    lVar12 = lVar12 + 0x18;
    p_Var11 = p_Var11 + 0x10;
  } while( true );
}

Assistant:

void Curiosity::Initialize(const ChFrame<>& pos) {
    assert(m_driver);

    // Initialize rover parts, fixing bodies to ground as requested
    m_chassis->Initialize(m_system, pos);
    m_diff_bar->Initialize(m_chassis->GetBody());

    for (int i = 0; i < 2; i++) {
        m_rockers[i]->Initialize(m_chassis->GetBody());
        m_bogies[i]->Initialize(m_chassis->GetBody());

        m_diff_links[i]->Initialize(m_chassis->GetBody());

        m_rocker_uprights[i]->Initialize(m_chassis->GetBody());
        m_bogie_uprights[i]->Initialize(m_chassis->GetBody());
    }
    for (int i = 0; i < 6; i++) {
        m_wheels[i]->Initialize(m_chassis->GetBody());
    }

    // Add drive motors on all six wheels
    ChQuaternion<> z2y = Q_from_AngX(CH_C_PI_2);  // align Z with (negative) Y

    // Front (wheels attached to rocker uprights)
    for (int i = 0; i < 2; i++) {
        switch (m_driver->GetDriveMotorType()) {
            case CuriosityDriver::DriveMotorType::SPEED:
                m_drive_motor_funcs[i] = chrono_types::make_shared<ChFunction_Setpoint>();
                m_drive_motors[i] = AddMotorSpeed(m_rocker_uprights[i]->GetBody(), m_wheels[i]->GetBody(), m_chassis,
                                                  wheel_pos[i], z2y);
                m_drive_motors[i]->SetMotorFunction(m_drive_motor_funcs[i]);
                break;
            case CuriosityDriver::DriveMotorType::TORQUE:
                AddRevoluteJoint(m_rocker_uprights[i]->GetBody(), m_wheels[i]->GetBody(), m_chassis, wheel_pos[i], z2y);
                break;
        }
    }

    // Middle (wheeled attached to bogies)
    for (int i = 2; i < 4; i++) {
        switch (m_driver->GetDriveMotorType()) {
            case CuriosityDriver::DriveMotorType::SPEED:
                m_drive_motor_funcs[i] = chrono_types::make_shared<ChFunction_Setpoint>();
                m_drive_motors[i] =
                    AddMotorSpeed(m_bogies[i - 2]->GetBody(), m_wheels[i]->GetBody(), m_chassis, wheel_pos[i], z2y);
                m_drive_motors[i]->SetMotorFunction(m_drive_motor_funcs[i]);
                break;
            case CuriosityDriver::DriveMotorType::TORQUE:
                AddRevoluteJoint(m_bogies[i - 2]->GetBody(), m_wheels[i]->GetBody(), m_chassis, wheel_pos[i], z2y);
                break;
        }
    }

    // Rear (wheels attached to bogie uprights)
    for (int i = 4; i < 6; i++) {
        switch (m_driver->GetDriveMotorType()) {
            case CuriosityDriver::DriveMotorType::SPEED:
                m_drive_motor_funcs[i] = chrono_types::make_shared<ChFunction_Setpoint>();
                m_drive_motors[i] = AddMotorSpeed(m_bogie_uprights[i - 4]->GetBody(), m_wheels[i]->GetBody(), m_chassis,
                                                  wheel_pos[i], z2y);
                m_drive_motors[i]->SetMotorFunction(m_drive_motor_funcs[i]);
                break;
            case CuriosityDriver::DriveMotorType::TORQUE:
                AddRevoluteJoint(m_bogie_uprights[i - 4]->GetBody(), m_wheels[i]->GetBody(), m_chassis, wheel_pos[i],
                                 z2y);
                break;
        }
    }

    double J = 0.1;  // shaft rotational inertia
    for (int i = 0; i < 6; i++) {
        m_drive_shafts[i]->SetInertia(J);
        m_system->Add(m_drive_shafts[i]);

        // Connect shaft aligned with the wheel's axis of rotation (local wheel Y).
        // Set connection such that a positive torque applied to the shaft results in forward rover motion.
        auto shaftbody_connection = chrono_types::make_shared<ChShaftsBody>();
        shaftbody_connection->Initialize(m_drive_shafts[i], m_wheels[i]->GetBody(), ChVector<>(0, -1, 0));
        m_system->Add(shaftbody_connection);
    }

    // Add steering motors
    ChVector<> rocker_motor_loc[] = {sr_rel_pos_lf, sr_rel_pos_rf};
    for (int i = 0; i < 2; i++) {
        m_rocker_motor_funcs[i] = chrono_types::make_shared<ChFunction_Const>(0.0);
        m_rocker_motors[i] = AddMotorAngle(m_rocker_uprights[i]->GetBody(), m_rockers[i]->GetBody(), m_chassis,
                                           rocker_motor_loc[i], Q_from_AngX(CH_C_PI));
        m_rocker_motors[i]->SetMotorFunction(m_rocker_motor_funcs[i]);
    }

    ChVector<> bogie_motor_loc[] = {sr_rel_pos_lb, sr_rel_pos_rb};
    for (int i = 0; i < 2; i++) {
        m_bogie_motor_funcs[i] = chrono_types::make_shared<ChFunction_Const>(0.0);
        m_bogie_motors[i] =
            AddMotorAngle(m_bogie_uprights[i]->GetBody(), m_bogies[i]->GetBody(), m_chassis, bogie_motor_loc[i], QUNIT);
        m_bogie_motors[i]->SetMotorFunction(m_bogie_motor_funcs[i]);
    }

    // Connect the differential bar to chassis
    m_diff_joint = AddRevoluteJoint(m_diff_bar->GetBody(), m_chassis->GetBody(), m_chassis, tr_rel_pos_t, QUNIT);

    // Connect differential links to differential bar and to the rockers
    AddRevoluteJoint(m_rockers[0]->GetBody(), m_diff_links[0]->GetBody(), m_chassis, tr_rel_pos_l, z2y);
    AddRevoluteJoint(m_rockers[1]->GetBody(), m_diff_links[1]->GetBody(), m_chassis, tr_rel_pos_r, z2y);
    AddRevoluteJoint(m_diff_links[0]->GetBody(), m_diff_bar->GetBody(), m_chassis,
                     tr_rel_pos_l + ChVector<>(tr_rel_pos_t.x() - tr_rel_pos_l.x(), 0, 0), QUNIT);
    AddRevoluteJoint(m_diff_links[1]->GetBody(), m_diff_bar->GetBody(), m_chassis,
                     tr_rel_pos_r + ChVector<>(tr_rel_pos_t.x() - tr_rel_pos_r.x(), 0, 0), QUNIT);

    // Add revolute joint for suspension rockers and bogies
    m_rocker_joints[0] = AddRevoluteJoint(m_rockers[0]->GetBody(), m_chassis->GetBody(), m_chassis, cr_rel_pos_lf, z2y);
    m_rocker_joints[1] = AddRevoluteJoint(m_rockers[1]->GetBody(), m_chassis->GetBody(), m_chassis, cr_rel_pos_rf, z2y);
    m_bogie_joints[0] =
        AddRevoluteJoint(m_bogies[0]->GetBody(), m_rockers[0]->GetBody(), m_chassis, cr_rel_pos_lb, z2y);
    m_bogie_joints[1] =
        AddRevoluteJoint(m_bogies[1]->GetBody(), m_rockers[1]->GetBody(), m_chassis, cr_rel_pos_rb, z2y);

    // Set initialization flag
    m_initialized = true;
}